

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMAddress.cpp
# Opt level: O1

ostream * operator<<(ostream *stream,ROMAddress *addr)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  ostream oVar4;
  ostream *poVar5;
  
  lVar2 = *(long *)stream;
  lVar3 = *(long *)(lVar2 + -0x18);
  uVar1 = *(undefined4 *)(stream + lVar3 + 0x18);
  *(undefined4 *)(stream + lVar3 + 0x18) = 8;
  lVar2 = *(long *)(lVar2 + -0x18);
  poVar5 = stream + lVar2;
  if (stream[lVar2 + 0xe1] == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar4;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x30;
  lVar2 = *(long *)stream;
  *(uint *)(stream + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(stream + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 0x10) = 2;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  *(undefined4 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) = uVar1;
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream &stream, const ROMAddress &addr) {
    auto flags = stream.flags(std::ios_base::hex);
    //so the address gets shown as big-endian no matter if the system is little-, middle- or big-endian
    stream << std::setfill('0') << std::uppercase << std::setw(2) << static_cast<uint16_t>(addr.bank()) << ":" << std::setw(4) << addr.bankAddress();
    stream.flags(flags);
    return stream;
}